

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_opldumper_mididevice.cpp
# Opt level: O3

int __thiscall OPLDumperMIDIDevice::Resume(OPLDumperMIDIDevice *this)

{
  OPLio *pOVar1;
  uint uVar2;
  _func_int **pp_Var3;
  
  pp_Var3 = (this->super_OPLMIDIDevice).super_SoftSynthMIDIDevice.super_MIDIDevice._vptr_MIDIDevice;
  while( true ) {
    uVar2 = (*pp_Var3[0x1e])(this);
    if (uVar2 == 0) break;
    pOVar1 = (this->super_OPLMIDIDevice).super_OPLmusicBlock.super_musicBlock.io;
    (*pOVar1->_vptr_OPLio[6])(pOVar1,(ulong)uVar2);
    pp_Var3 = (this->super_OPLMIDIDevice).super_SoftSynthMIDIDevice.super_MIDIDevice.
              _vptr_MIDIDevice;
  }
  return 0;
}

Assistant:

int OPLDumperMIDIDevice::Resume()
{
	int time;

	time = PlayTick();
	while (time != 0)
	{
		io->WriteDelay(time);
		time = PlayTick();
	}
	return 0;
}